

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O1

int amqp_decode_properties(uint16_t class_id,amqp_pool_t *pool,amqp_bytes_t encoded,void **decoded)

{
  ulong uVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  uint *puVar5;
  byte bVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong local_38;
  
  pvVar7 = encoded.bytes;
  uVar8 = encoded.len;
  bVar6 = 0;
  uVar9 = 0;
  uVar10 = 0;
  do {
    local_38 = uVar10 + 2;
    if (uVar8 < local_38) {
      return -2;
    }
    uVar3 = *(ushort *)((long)pvVar7 + uVar10) >> 8;
    uVar9 = uVar9 | (uint)(ushort)(*(ushort *)((long)pvVar7 + uVar10) << 8 | uVar3) <<
                    (bVar6 & 0x1f);
    bVar6 = bVar6 + 0x10;
    uVar10 = local_38;
  } while ((uVar3 & 1) != 0);
  if (class_id < 0x32) {
    if (class_id < 0x1e) {
      if ((class_id != 10) && (class_id != 0x14)) {
        return -3;
      }
    }
    else if ((class_id != 0x1e) && (class_id != 0x28)) {
      return -3;
    }
  }
  else if (class_id < 0x55) {
    if (class_id != 0x32) {
      if (class_id != 0x3c) {
        return -3;
      }
      puVar5 = (uint *)amqp_pool_alloc(pool,200);
      if (puVar5 == (uint *)0x0) {
        return -1;
      }
      *puVar5 = uVar9;
      if ((short)uVar9 < 0) {
        uVar10 = local_38 + 1;
        if (uVar8 < uVar10) {
          return -2;
        }
        bVar6 = *(byte *)((long)pvVar7 + local_38);
        local_38 = bVar6 + uVar10;
        if (uVar8 < local_38) {
          return -2;
        }
        *(ulong *)(puVar5 + 4) = uVar10 + (long)pvVar7;
        *(ulong *)(puVar5 + 2) = (ulong)bVar6;
      }
      if ((uVar9 >> 0xe & 1) != 0) {
        uVar10 = local_38 + 1;
        if (uVar8 < uVar10) {
          return -2;
        }
        bVar6 = *(byte *)((long)pvVar7 + local_38);
        local_38 = bVar6 + uVar10;
        if (uVar8 < local_38) {
          return -2;
        }
        *(ulong *)(puVar5 + 8) = uVar10 + (long)pvVar7;
        *(ulong *)(puVar5 + 6) = (ulong)bVar6;
      }
      if (((uVar9 >> 0xd & 1) != 0) &&
         (iVar4 = amqp_decode_table(encoded,pool,(amqp_table_t *)(puVar5 + 10),&local_38), iVar4 < 0
         )) {
        return iVar4;
      }
      if ((uVar9 >> 0xc & 1) != 0) {
        if (uVar8 < local_38 + 1) {
          return -2;
        }
        *(undefined1 *)(puVar5 + 0xe) = *(undefined1 *)((long)pvVar7 + local_38);
        local_38 = local_38 + 1;
      }
      if ((uVar9 >> 0xb & 1) != 0) {
        if (uVar8 < local_38 + 1) {
          return -2;
        }
        *(undefined1 *)((long)puVar5 + 0x39) = *(undefined1 *)((long)pvVar7 + local_38);
        local_38 = local_38 + 1;
      }
      if ((uVar9 >> 10 & 1) != 0) {
        uVar10 = local_38 + 1;
        if (uVar8 < uVar10) {
          bVar2 = false;
          local_38 = uVar10;
        }
        else {
          bVar6 = *(byte *)((long)pvVar7 + local_38);
          local_38 = bVar6 + uVar10;
          bVar2 = local_38 <= uVar8;
          if (local_38 <= uVar8) {
            *(ulong *)(puVar5 + 0x12) = uVar10 + (long)pvVar7;
            *(ulong *)(puVar5 + 0x10) = (ulong)bVar6;
          }
        }
        if (!bVar2) {
          return -2;
        }
      }
      if ((uVar9 >> 9 & 1) != 0) {
        uVar10 = local_38 + 1;
        if (uVar8 < uVar10) {
          bVar2 = false;
          local_38 = uVar10;
        }
        else {
          bVar6 = *(byte *)((long)pvVar7 + local_38);
          local_38 = bVar6 + uVar10;
          bVar2 = local_38 <= uVar8;
          if (local_38 <= uVar8) {
            *(ulong *)(puVar5 + 0x16) = uVar10 + (long)pvVar7;
            *(ulong *)(puVar5 + 0x14) = (ulong)bVar6;
          }
        }
        if (!bVar2) {
          return -2;
        }
      }
      if ((uVar9 >> 8 & 1) != 0) {
        uVar10 = local_38 + 1;
        if (uVar8 < uVar10) {
          bVar2 = false;
          local_38 = uVar10;
        }
        else {
          bVar6 = *(byte *)((long)pvVar7 + local_38);
          local_38 = bVar6 + uVar10;
          bVar2 = local_38 <= uVar8;
          if (local_38 <= uVar8) {
            *(ulong *)(puVar5 + 0x1a) = uVar10 + (long)pvVar7;
            *(ulong *)(puVar5 + 0x18) = (ulong)bVar6;
          }
        }
        if (!bVar2) {
          return -2;
        }
      }
      if ((char)uVar9 < '\0') {
        uVar10 = local_38 + 1;
        if (uVar8 < uVar10) {
          bVar2 = false;
          local_38 = uVar10;
        }
        else {
          bVar6 = *(byte *)((long)pvVar7 + local_38);
          local_38 = bVar6 + uVar10;
          bVar2 = local_38 <= uVar8;
          if (local_38 <= uVar8) {
            *(ulong *)(puVar5 + 0x1e) = uVar10 + (long)pvVar7;
            *(ulong *)(puVar5 + 0x1c) = (ulong)bVar6;
          }
        }
        if (!bVar2) {
          return -2;
        }
      }
      if ((uVar9 & 0x40) != 0) {
        if (uVar8 < local_38 + 8) {
          return -2;
        }
        uVar10 = *(ulong *)((long)pvVar7 + local_38);
        *(ulong *)(puVar5 + 0x20) =
             uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
             (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
             (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 |
             uVar10 << 0x38;
        local_38 = local_38 + 8;
      }
      if ((uVar9 & 0x20) != 0) {
        uVar10 = local_38 + 1;
        if (uVar8 < uVar10) {
          bVar2 = false;
          local_38 = uVar10;
        }
        else {
          bVar6 = *(byte *)((long)pvVar7 + local_38);
          local_38 = bVar6 + uVar10;
          bVar2 = local_38 <= uVar8;
          if (local_38 <= uVar8) {
            *(ulong *)(puVar5 + 0x24) = uVar10 + (long)pvVar7;
            *(ulong *)(puVar5 + 0x22) = (ulong)bVar6;
          }
        }
        if (!bVar2) {
          return -2;
        }
      }
      if ((uVar9 & 0x10) != 0) {
        uVar10 = local_38 + 1;
        if (uVar8 < uVar10) {
          bVar2 = false;
          local_38 = uVar10;
        }
        else {
          bVar6 = *(byte *)((long)pvVar7 + local_38);
          local_38 = bVar6 + uVar10;
          bVar2 = local_38 <= uVar8;
          if (local_38 <= uVar8) {
            *(ulong *)(puVar5 + 0x28) = uVar10 + (long)pvVar7;
            *(ulong *)(puVar5 + 0x26) = (ulong)bVar6;
          }
        }
        if (!bVar2) {
          return -2;
        }
      }
      if ((uVar9 & 8) != 0) {
        uVar10 = local_38 + 1;
        if (uVar8 < uVar10) {
          bVar2 = false;
          local_38 = uVar10;
        }
        else {
          bVar6 = *(byte *)((long)pvVar7 + local_38);
          local_38 = bVar6 + uVar10;
          bVar2 = local_38 <= uVar8;
          if (local_38 <= uVar8) {
            *(ulong *)(puVar5 + 0x2c) = uVar10 + (long)pvVar7;
            *(ulong *)(puVar5 + 0x2a) = (ulong)bVar6;
          }
        }
        if (!bVar2) {
          return -2;
        }
      }
      if ((uVar9 & 4) != 0) {
        uVar10 = local_38 + 1;
        if (uVar8 < uVar10) {
          bVar2 = false;
        }
        else {
          bVar6 = *(byte *)((long)pvVar7 + local_38);
          uVar1 = bVar6 + uVar10;
          bVar2 = uVar1 <= uVar8;
          if (uVar1 <= uVar8) {
            *(ulong *)(puVar5 + 0x30) = (long)pvVar7 + uVar10;
            *(ulong *)(puVar5 + 0x2e) = (ulong)bVar6;
          }
        }
        if (!bVar2) {
          return -2;
        }
      }
      *decoded = puVar5;
      return 0;
    }
  }
  else if ((class_id != 0x55) && (class_id != 0x5a)) {
    return -3;
  }
  puVar5 = (uint *)amqp_pool_alloc(pool,8);
  if (puVar5 != (uint *)0x0) {
    *puVar5 = uVar9;
    *decoded = puVar5;
    return 0;
  }
  return -1;
}

Assistant:

int amqp_decode_properties(uint16_t class_id, amqp_pool_t *pool,
                           amqp_bytes_t encoded, void **decoded) {
  size_t offset = 0;

  amqp_flags_t flags = 0;
  int flagword_index = 0;
  uint16_t partial_flags;

  do {
    if (!amqp_decode_16(encoded, &offset, &partial_flags))
      return AMQP_STATUS_BAD_AMQP_DATA;
    flags |= (partial_flags << (flagword_index * 16));
    flagword_index++;
  } while (partial_flags & 1);

  switch (class_id) {
    case 10: {
      amqp_connection_properties_t *p =
          (amqp_connection_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_connection_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 20: {
      amqp_channel_properties_t *p =
          (amqp_channel_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_channel_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 30: {
      amqp_access_properties_t *p = (amqp_access_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_access_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 40: {
      amqp_exchange_properties_t *p =
          (amqp_exchange_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_exchange_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 50: {
      amqp_queue_properties_t *p = (amqp_queue_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_queue_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 60: {
      amqp_basic_properties_t *p = (amqp_basic_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_basic_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      if (flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->content_type, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_CONTENT_ENCODING_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->content_encoding, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_HEADERS_FLAG) {
        {
          int res = amqp_decode_table(encoded, pool, &(p->headers), &offset);
          if (res < 0) return res;
        }
      }
      if (flags & AMQP_BASIC_DELIVERY_MODE_FLAG) {
        if (!amqp_decode_8(encoded, &offset, &p->delivery_mode))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_PRIORITY_FLAG) {
        if (!amqp_decode_8(encoded, &offset, &p->priority))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CORRELATION_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->correlation_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_REPLY_TO_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->reply_to, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_EXPIRATION_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->expiration, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_MESSAGE_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->message_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_TIMESTAMP_FLAG) {
        if (!amqp_decode_64(encoded, &offset, &p->timestamp))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_TYPE_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->type, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_USER_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->user_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_APP_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->app_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_CLUSTER_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->cluster_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      *decoded = p;
      return 0;
    }
    case 90: {
      amqp_tx_properties_t *p = (amqp_tx_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_tx_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 85: {
      amqp_confirm_properties_t *p =
          (amqp_confirm_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_confirm_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    default:
      return AMQP_STATUS_UNKNOWN_CLASS;
  }
}